

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

void __thiscall CWire::Print(CWire *this,FILE *pFile,int Mode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  CPoint *pCVar6;
  CPoint *pCVar7;
  CObject *pCVar8;
  int iVar9;
  longlong in_RAX;
  size_t sVar10;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar11;
  pointer ppCVar12;
  undefined4 in_ECX;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  longlong Key;
  
  if (pFile == (FILE *)0x0) {
    return;
  }
  Key = in_RAX;
  if (Mode < 0x80) {
    if (Mode < 0x10) {
      if (Mode == 0) {
        pCVar6 = this->m_pPointE;
        pCVar7 = this->m_pPointS;
        fprintf((FILE *)pFile,"-w (%d,%d,%d)-(%d,%d,%d) %c",(ulong)(uint)(int)pCVar7->m_iX,
                (ulong)(uint)(int)pCVar7->m_iY,(ulong)(uint)(int)pCVar7->m_cZ,
                (ulong)(uint)(int)pCVar6->m_iX,(ulong)(uint)(int)pCVar6->m_iY,
                (ulong)(uint)(int)pCVar6->m_cZ,
                (ulong)((uint)(((this->super_CObject).m_iState & 1) == 0) * 9 + 0x6f));
        pCVar8 = (this->super_CObject).m_pParent;
        if (pCVar8 != (CObject *)0x0) {
          fprintf((FILE *)pFile,":net(id:%d) ",(ulong)(uint)pCVar8->m_Key);
        }
        fputc(10,(FILE *)pFile);
        goto LAB_0011fffe;
      }
      if (Mode != 1) goto LAB_00120099;
      uVar13 = (uint)this->m_pPointS->m_iX;
      uVar16 = (uint)this->m_pPointS->m_iY;
      fprintf((FILE *)pFile,"plot([%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar13,(ulong)uVar13,
              (ulong)uVar16,(ulong)uVar16,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      uVar13 = (uint)this->m_pPointE->m_iX;
      uVar16 = (uint)this->m_pPointE->m_iY;
      fprintf((FILE *)pFile,"plot([%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar13,(ulong)uVar13,
              (ulong)uVar16,(ulong)uVar16,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      uVar14 = (ulong)(uint)(int)this->m_pPointS->m_iX;
      uVar19 = (ulong)(uint)(int)this->m_pPointE->m_iX;
      uVar13 = (uint)this->m_pPointS->m_iY;
      sVar4 = this->m_pPointE->m_iY;
      pcVar17 = "-";
      if (((this->super_CObject).m_iState & 1) == 0) {
        pcVar17 = "-.";
      }
      pcVar15 = "plot([%d,%d],[%d,%d],\'%s\');\n";
    }
    else {
      if (Mode == 0x10) {
        fprintf((FILE *)pFile,"-------------net(id:%d) - (%d,%d)-(%d,%d)\n",
                (ulong)(uint)((this->super_CObject).m_pParent)->m_Key,
                (ulong)(uint)(int)this->m_pPointS->m_iX,(ulong)(uint)(int)this->m_pPointS->m_iY,
                (ulong)(uint)(int)this->m_pPointE->m_iX,(ulong)(uint)(int)this->m_pPointE->m_iY);
        fflush((FILE *)pFile);
        if (0 < (int)((ulong)((long)(this->m_SegmentList).
                                    super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_SegmentList).
                                   super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
          uVar13 = 0;
          do {
            pvVar11 = GetSegmentList(this,uVar13);
            fprintf((FILE *)pFile,"*segment[%d]\n",(ulong)uVar13);
            ppCVar12 = (pvVar11->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            if ((pvVar11->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_finish != ppCVar12) {
              uVar19 = 0;
              do {
                (*(ppCVar12[uVar19]->super_CObject)._vptr_CObject[2])(ppCVar12[uVar19],pFile,0);
                uVar19 = uVar19 + 1;
                ppCVar12 = (pvVar11->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                           _M_impl.super__Vector_impl_data._M_start;
              } while (uVar19 < (ulong)((long)(pvVar11->
                                              super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppCVar12 >> 3));
            }
            uVar13 = uVar13 + 1;
            iVar9 = (int)((ulong)((long)(this->m_SegmentList).
                                        super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_SegmentList).
                                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
          } while (SBORROW4(uVar13,iVar9 * -0x55555555) != (int)(uVar13 + iVar9 * 0x55555555) < 0);
        }
        goto LAB_0011fffe;
      }
      if (Mode != 0x40) goto LAB_00120099;
      pCVar6 = this->m_pPointS;
      uVar14 = (ulong)(uint)(int)pCVar6->m_iX;
      uVar19 = (ulong)(uint)(int)pCVar6->m_iY;
      if ((CObject::m_pDesign->field_0xc51 & 4) == 0) {
        fprintf((FILE *)pFile,"(%d,%d,0)-(%d,%d,0)\n",uVar14,uVar19,
                (ulong)(uint)(int)this->m_pPointE->m_iX,(ulong)(uint)(int)this->m_pPointE->m_iY);
        goto LAB_0011fffe;
      }
      uVar13 = (uint)pCVar6->m_cZ;
      sVar4 = this->m_pPointE->m_iX;
      sVar5 = this->m_pPointE->m_iY;
      pcVar15 = "(%d,%d,%d)-(%d,%d,%d)\n";
LAB_0011ffec:
      pcVar17 = (char *)(ulong)(uint)(int)sVar5;
    }
    fprintf((FILE *)pFile,pcVar15,uVar14,uVar19,(ulong)uVar13,(ulong)(uint)(int)sVar4,pcVar17);
  }
  else {
    if (Mode < 0x200) {
      if (Mode != 0x80) {
        if (Mode != 0x100) goto LAB_00120099;
        uVar19._0_4_ = (this->super_CObject).m_iProp;
        uVar19._4_4_ = (this->super_CObject).m_iState;
        auVar21._0_4_ = -(uint)((uVar19 & 5) == 0);
        auVar21._4_4_ = -(uint)((uVar19 & 5) == 0);
        auVar21._8_4_ = -(uint)((uVar19 & 0x100000000) == 0);
        auVar21._12_4_ = -(uint)((uVar19 & 0x100000000) == 0);
        uVar13 = movmskpd(in_ECX,auVar21);
        uVar14 = (ulong)((uint)((uVar13 & 2) == 0) * 3);
        uVar19 = (ulong)((uVar13 & 1) + 3);
        uVar13 = (uint)this->m_pPointS->m_iX;
        sVar4 = this->m_pPointS->m_iY;
        sVar5 = this->m_pPointE->m_iX;
        pcVar15 = "plot \'-\' w linespoints lt %d lw 1 pt %d ps 1\n %d %d\n %d %d\ne\n";
        goto LAB_0011ffec;
      }
      pCVar6 = this->m_pPointS;
      fprintf((FILE *)pFile,"plot3([%d,%d],[%d,%d],[%d,%d],\'%c\');\n",
              (ulong)(uint)(int)pCVar6->m_iX,(ulong)(uint)(int)pCVar6->m_iX,
              (ulong)(uint)(int)pCVar6->m_iY,(ulong)(uint)(int)pCVar6->m_iY,
              (ulong)(uint)(int)pCVar6->m_cZ,(ulong)(uint)(int)pCVar6->m_cZ,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      pCVar6 = this->m_pPointE;
      fprintf((FILE *)pFile,"plot3([%d,%d],[%d,%d],[%d,%d],\'%c\');\n",
              (ulong)(uint)(int)pCVar6->m_iX,(ulong)(uint)(int)pCVar6->m_iX,
              (ulong)(uint)(int)pCVar6->m_iY,(ulong)(uint)(int)pCVar6->m_iY,
              (ulong)(uint)(int)pCVar6->m_cZ,(ulong)(uint)(int)pCVar6->m_cZ,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      pCVar6 = this->m_pPointE;
      pCVar7 = this->m_pPointS;
      uVar13 = (uint)pCVar7->m_iX;
      uVar16 = (uint)pCVar6->m_iX;
      sVar5 = pCVar7->m_iY;
      sVar4 = pCVar6->m_iY;
      cVar3 = pCVar7->m_cZ;
      uVar18 = (uint)pCVar6->m_cZ;
      pcVar17 = "-";
      if (((this->super_CObject).m_iState & 1) == 0) {
        pcVar17 = "-.";
      }
      pcVar15 = "plot3([%d,%d],[%d,%d],[%d,%d],\'%s\');\n";
    }
    else {
      if (Mode != 0x200) {
        if (Mode == 0x2000) {
          Key = (this->m_pPointS->super_CObject).m_Key;
          if ((~(this->super_CObject).m_iState & 5U) == 0) {
            sVar10 = fwrite(&Key,1,8,(FILE *)pFile);
            if (sVar10 == 0) {
              CObject::Display(1,"print a wire(S) in net(id:%d)\n",
                               (ulong)(uint)((this->super_CObject).m_pParent)->m_Key);
            }
            Key = (this->m_pPointE->super_CObject).m_Key;
          }
          else {
            Key = (longlong)((uint)Key & 0xffffff00);
            sVar10 = fwrite(&Key,1,8,(FILE *)pFile);
            if (sVar10 == 0) {
              CObject::Display(1,"print a wire(S) in net(id:%d)\n",
                               (ulong)(uint)((this->super_CObject).m_pParent)->m_Key);
            }
            Key = (longlong)((uint)(this->m_pPointE->super_CObject).m_Key & 0xffffff00);
          }
          sVar10 = fwrite(&Key,1,8,(FILE *)pFile);
          if (sVar10 == 0) {
            CObject::Display(1,"print a wire(E) in net(id:%d)\n",
                             (ulong)(uint)((this->super_CObject).m_pParent)->m_Key);
          }
          goto LAB_0011fffe;
        }
LAB_00120099:
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x335,"virtual void CWire::Print(FILE *, int)");
      }
      uVar1 = (this->super_CObject).m_iProp;
      uVar2 = (this->super_CObject).m_iState;
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar2;
      auVar20._12_4_ = uVar2;
      auVar20 = auVar20 & _DAT_0016f130;
      auVar22._0_4_ = -(uint)(auVar20._0_4_ == 0);
      auVar22._4_4_ = -(uint)(auVar20._4_4_ == 0);
      auVar22._8_4_ = -(uint)(auVar20._8_4_ == 0);
      auVar22._12_4_ = -(uint)(auVar20._12_4_ == 0);
      uVar16 = movmskpd(in_ECX,auVar22);
      uVar13 = (uint)((uVar16 & 2) == 0) * 3;
      uVar16 = (uVar16 & 1) + 3;
      pCVar6 = this->m_pPointS;
      sVar5 = pCVar6->m_iX;
      sVar4 = pCVar6->m_iY;
      cVar3 = pCVar6->m_cZ;
      uVar18 = (uint)this->m_pPointE->m_iX;
      pcVar17 = (char *)(ulong)(uint)(int)this->m_pPointE->m_iY;
      pcVar15 = "splot \'-\' w linespoints lt %d lw 1 pt %d ps 1\n %d %d %d\n %d %d %d\ne\n";
    }
    fprintf((FILE *)pFile,pcVar15,(ulong)uVar13,(ulong)uVar16,(ulong)(uint)(int)sVar5,
            (ulong)(uint)(int)sVar4,(ulong)(uint)(int)cVar3,(ulong)uVar18,pcVar17);
  }
LAB_0011fffe:
  fflush((FILE *)pFile);
  return;
}

Assistant:

void CWire::Print(FILE *pFile, int Mode)
{
	if(pFile==NULL)	return;

	switch(Mode){
	case PRINT_MODE_DUMP:
		{
			KEY	Key;

			if(IsCompleted())
			{
				Key		=	m_pPointS->GetKey();
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(S) in net(id:%d)\n",(int)GetParent()->GetKey());

				Key		=	m_pPointE->GetKey();
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(E) in net(id:%d)\n",(int)GetParent()->GetKey());
			}
			else
			{
				Key		=	m_pPointS->GetKey()&0xFFFFFF00;
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(S) in net(id:%d)\n",(int)GetParent()->GetKey());

				Key		=	m_pPointE->GetKey()&0xFFFFFF00;
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(E) in net(id:%d)\n",(int)GetParent()->GetKey());
			}
		}
		break;
	case PRINT_MODE_GNUPLOT:
		fprintf(pFile,"plot '-' w linespoints lt %d lw 1 pt %d ps 1\n %d %d\n %d %d\ne\n",
			IsRouted()? 3:0,
			IsHorizontal()? 3:4,
			m_pPointS->X(),m_pPointS->Y(),
			m_pPointE->X(),m_pPointE->Y());
		break;
	case PRINT_MODE_GNUPLOT3D:
		fprintf(pFile,"splot '-' w linespoints lt %d lw 1 pt %d ps 1\n %d %d %d\n %d %d %d\ne\n",
			IsRouted()? 3:0,
			IsHorizontal()? 3:4,
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		break;
	case PRINT_MODE_MATLAB:
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%c');\n",
			m_pPointS->X(),m_pPointS->X(),m_pPointS->Y(),m_pPointS->Y(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%c');\n",
			m_pPointE->X(),m_pPointE->X(),m_pPointE->Y(),m_pPointE->Y(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%s');\n",
			m_pPointS->X(),m_pPointE->X(),
			m_pPointS->Y(),m_pPointE->Y(),
			IsRouted()? "-":"-.");			
		break;
	case PRINT_MODE_MATLAB3D:
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%c');\n",
			m_pPointS->X(),m_pPointS->X(),
			m_pPointS->Y(),m_pPointS->Y(),
			m_pPointS->Z(),m_pPointS->Z(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%c');\n",
			m_pPointE->X(),m_pPointE->X(),
			m_pPointE->Y(),m_pPointE->Y(),
			m_pPointE->Z(),m_pPointE->Z(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%s');\n",
			m_pPointS->X(),m_pPointE->X(),
			m_pPointS->Y(),m_pPointE->Y(),
			m_pPointS->Z(),m_pPointE->Z(),
			IsRouted()? "-":"-.");			
		break;
	case PRINT_MODE_SEGMENT:
		{
			fprintf(pFile,"-------------net(id:%d) - (%d,%d)-(%d,%d)\n",
				(int)GetParent()->GetKey(),
				m_pPointS->X(),m_pPointS->Y(),
				m_pPointE->X(),m_pPointE->Y());fflush(pFile);

			for (int i=0;i<GetNumSegmentList();++i)
			{
				vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
				fprintf(pFile,"*segment[%d]\n",i);
				for (int j=0;j<pSegmentList->size();++j)
					(*pSegmentList)[j]->Print(pFile,PRINT_MODE_TEXT);
			}
		}
		break;
	case PRINT_MODE_TEXT:	
#ifdef _DEBUG
		fprintf(pFile,"-w[0x%x] (%d,%d,%d)-(%d,%d,%d) %c",(ADDRESS)this,
#else
		fprintf(pFile,"-w (%d,%d,%d)-(%d,%d,%d) %c",
#endif
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z(),
			IsRouted()? 'o':'x');
		if(GetParent())	fprintf(pFile,":net(id:%d) ",(int)GetParent()->GetKey());
		fprintf(pFile,"\n");
		break;
	case PRINT_MODE_RESULT:
		if(GetDesign()->m_Param.GetProp()&PROP_PARAM_MULTILAYER)
		{
			fprintf(pFile,"(%d,%d,%d)-(%d,%d,%d)\n",
				m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
				m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		}
		else
		{
			fprintf(pFile,"(%d,%d,0)-(%d,%d,0)\n",
				m_pPointS->X(),m_pPointS->Y(),
				m_pPointE->X(),m_pPointE->Y());
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}